

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O1

void __thiscall
AllocationPolicyManager::ReportFailure(AllocationPolicyManager *this,size_t byteCount)

{
  undefined4 *puVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 *in_FS_OFFSET;
  
  if (this[0x10] == (AllocationPolicyManager)0x1) {
    CCLock::Enter((CCLock *)(this + 0x18));
    if (*(ulong *)(this + 8) < byteCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/AllocationPolicyManager.h"
                         ,0x9f,"(currentMemory >= byteCount)","currentMemory >= byteCount");
      if (!bVar4) {
LAB_00256e68:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
    uVar2 = *(ulong *)(this + 8);
    if (uVar2 < byteCount) {
      byteCount = uVar2;
    }
    *(ulong *)(this + 8) = uVar2 - byteCount;
    if (*(code **)(this + 0x60) != (code *)0x0) {
      (**(code **)(this + 0x60))(*(undefined8 *)(this + 0x58),2,byteCount);
    }
    CCLock::Leave((CCLock *)(this + 0x18));
  }
  else {
    if (*(ulong *)(this + 8) < byteCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/AllocationPolicyManager.h"
                         ,0x9f,"(currentMemory >= byteCount)","currentMemory >= byteCount");
      if (!bVar4) goto LAB_00256e68;
      *puVar1 = 0;
    }
    uVar2 = *(ulong *)(this + 8);
    if (uVar2 < byteCount) {
      byteCount = uVar2;
    }
    *(ulong *)(this + 8) = uVar2 - byteCount;
    if (*(code **)(this + 0x60) != (code *)0x0) {
      (**(code **)(this + 0x60))(*(undefined8 *)(this + 0x58),2,byteCount);
      return;
    }
  }
  return;
}

Assistant:

void ReportFailure(size_t byteCount)
    {
        if (supportConcurrency)
        {
            AutoCriticalSection auto_cs(&cs);
            ReportFreeImpl(MemoryAllocateEvent::MemoryFailure, byteCount);
        }
        else
        {
            ReportFreeImpl(MemoryAllocateEvent::MemoryFailure, byteCount);
        }

    }